

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Question_&> __thiscall
capnp::_::anon_unknown_18::
ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question>::find
          (ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Question> *this,
          uint id)

{
  long lVar1;
  long lVar2;
  uint in_EDX;
  undefined4 in_register_00000034;
  long *plVar3;
  uint id_local;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,id);
  if ((int)in_EDX < 0) {
    kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>::
    find<unsigned_int&>((HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Question>
                         *)this,(uint *)(plVar3 + 8));
  }
  else {
    lVar1 = *plVar3;
    if (((ulong)in_EDX < (ulong)((plVar3[1] - lVar1) / 0x28)) &&
       ((lVar2 = (ulong)in_EDX * 0x28, *(char *)(lVar1 + 0x20 + lVar2) != '\0' ||
        (*(long *)(lVar1 + 0x18 + lVar2) != 0)))) {
      (this->slots).builder.ptr = (Question *)(lVar1 + lVar2);
    }
    else {
      (this->slots).builder.ptr = (Question *)0x0;
    }
  }
  return (Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Question_&>)(Question *)this;
}

Assistant:

kj::Maybe<T&> find(Id id) {
    if (isHigh(id)) {
      return highSlots.find(id);
    } else if (id < slots.size() && slots[id] != nullptr) {
      return slots[id];
    } else {
      return kj::none;
    }
  }